

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_pollq_epoll.c
# Opt level: O0

int nni_posix_pollq_sysinit(nng_init_params *params)

{
  short sVar1;
  int iVar2;
  int local_20;
  int rv;
  int i;
  int16_t max_thr;
  int16_t num_thr;
  nng_init_params *params_local;
  
  sVar1 = params->max_poller_threads;
  rv._2_2_ = params->num_poller_threads;
  if ((0 < sVar1) && (sVar1 < rv._2_2_)) {
    rv._2_2_ = sVar1;
  }
  if (rv._2_2_ < 1) {
    rv._2_2_ = 1;
  }
  params->num_poller_threads = rv._2_2_;
  nni_epoll_pqs = (nni_posix_pollq *)nni_zalloc((long)rv._2_2_ * 0x120);
  if (nni_epoll_pqs == (nni_posix_pollq *)0x0) {
    params_local._4_4_ = 2;
  }
  else {
    nni_epoll_npq = (int)rv._2_2_;
    for (local_20 = 0; local_20 < rv._2_2_; local_20 = local_20 + 1) {
      iVar2 = nni_epoll_pq_create(nni_epoll_pqs + local_20);
      if (iVar2 != 0) {
        nni_posix_pollq_sysfini();
        return iVar2;
      }
    }
    params_local._4_4_ = 0;
  }
  return params_local._4_4_;
}

Assistant:

int
nni_posix_pollq_sysinit(nng_init_params *params)
{
	int16_t num_thr;
	int16_t max_thr;

	max_thr = params->max_poller_threads;
	num_thr = params->num_poller_threads;

	if ((max_thr > 0) && (num_thr > max_thr)) {
		num_thr = max_thr;
	}
	if (num_thr < 1) {
		num_thr = 1;
	}
	params->num_poller_threads = num_thr;
	if ((nni_epoll_pqs = NNI_ALLOC_STRUCTS(nni_epoll_pqs, num_thr)) ==
	    NULL) {
		return (NNG_ENOMEM);
	}

	nni_epoll_npq = num_thr;
	for (int i = 0; i < num_thr; i++) {
		int rv;
		if ((rv = nni_epoll_pq_create(&nni_epoll_pqs[i])) != 0) {
			nni_posix_pollq_sysfini();
			return (rv);
		}
	}
	return (0);
}